

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O2

void __thiscall transaction_tests::tx_invalid::test_method(tx_invalid *this)

{
  long lVar1;
  string strFlags;
  bool bVar2;
  _Rb_tree_color flags;
  _Rb_tree_color _Var3;
  UniValue *pUVar4;
  UniValue *pUVar5;
  UniValue *pUVar6;
  string *psVar7;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this_00;
  long lVar8;
  mapped_type *pmVar9;
  uint64_t uVar10;
  _Base_ptr p_Var11;
  PrecomputedTransactionData *in_R8;
  PrecomputedTransactionData *txdata_00;
  UniValue *in_R9;
  uint uVar12;
  uint uVar13;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  string_view jsondata;
  string_view hex;
  const_string file;
  const_string file_00;
  string_view hex_str;
  Span<const_std::byte> sp;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  undefined4 in_stack_fffffffffffffa08;
  undefined4 in_stack_fffffffffffffa0c;
  check_type cVar14;
  RandomMixin<FastRandomContext> *this_01;
  char *in_stack_fffffffffffffa20;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  assertion_result local_570;
  char *local_558;
  assertion_result local_550;
  _Rb_tree_node_base *local_538;
  assertion_result local_530;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 local_4b8 [16];
  undefined ***local_4a8;
  UniValue *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  DataStream stream;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 local_3c8 [8];
  element_type *local_3c0;
  _Alloc_hider _Stack_3b8;
  UniValue *local_3b0;
  string local_398 [32];
  PrecomputedTransactionData txdata;
  TxValidationState state;
  CTransaction tx;
  string transaction;
  UniValue inputs;
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  mapprevOutValues;
  map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
  mapprevOutScriptPubKeys;
  string strTest;
  UniValue tests;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  jsondata._M_str =
       "[\n[\"The following are deserialized transactions which are invalid.\"],\n[\"They are in the form\"],\n[\"[[[prevout hash, prevout index, prevout scriptPubKey, amount?], [input 2], ...],\"],\n[\"serializedTransaction, verifyFlags]\"],\n[\"Use BADTX for verifyFlags if it is expected to fail CheckTransaction()\"],\n[\"Objects that are only a single string (like this one) are ignored\"],\n\n[\"0e1b5688cf179cd9f7cbda1fac0090f6e684bbf8cd946660120197c3f3681809 but with extra junk appended to the end of the scriptPubKey\"],\n[[[\"6ca7ec7b1847f6bdbd737176050e6a08d66ccd55bb94ad24f4018024107a5827\", 0, \"0x41 0x043b640e983c9690a14c039a2037ecc3467b27a0dcd58f19d76c7bc118d09fec45adc5370a1c5bf8067ca9f5557a4cf885fdb0fe0dcc9c3a7137226106fbc779a5 CHECKSIG VERIFY 1\"]],\n\"010000000127587a10248001f424ad94bb55cd6cd6086a0e05767173bdbdf647187beca76c000000004948304502201b822ad10d6adc1a341ae8835be3f70a25201bbff31f59cbb9c5353a5f0eca18022100ea7b2f7074e9aa9cf70aa8d0ffee13e6b45dddabf1ab961bda378bcdb778fa4701ffffffff0100f2052a010000001976a914fc50c5907d86fed474ba5ce8b12a66e0a4c139d888ac00000000\", \"NONE\"],\n\n[\"This is the nearly-standard transaction with CHECKSIGVERIFY 1 instead of CHECKSIG from tx_valid.json\"],\n[\"but with the signature duplicated in the scriptPubKey with a non-standard pushdata prefix\"],\n[\"See FindAndDelete, which will only remove if it uses the same pushdata prefix as is standard\"],\n[[[\"0000000000000000000000000000000000000000000000000000000000000100\", 0, \"DUP HASH160 0x14 0x5b6462475454710f3c22f5fdf0b40704c92f25c3 EQUALVERIFY CHECKSIGVERIFY 1 0x4c 0x47 0x3044022067288ea50aa799543a536ff9306f8e1cba05b9c6b10951175b924f96732555ed022026d7b5265f38d21541519e4a1e55044d5b9e17e15cdbaf29ae3792e99e883e7a01\"]],\n\"01000000010001000000000000000000000000000000000000000000000000000000000000000000006a473044022067288ea50aa799543a536ff9306f8e1cba05b9c6b10951175b924f96732555ed022026d7b5265f38d21541519e4a1e55044d5b9e17e15cdbaf29ae3792e99e883e7a012103ba8c8b86dea131c22ab967e6dd99bdae8eff7a1f75a2c35f1f944109e3fe5e22ffffffff010000000000000000015100000000\", \"NONE\"],\n\n[\"Same as ab..." /* TRUNCATED STRING LITERAL */
  ;
  jsondata._M_len = 0xd0a4;
  read_json(&tests,jsondata);
  this_01 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng.super_RandomMixin<FastRandomContext>;
  uVar13 = 0;
  do {
    if ((ulong)(((long)tests.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)tests.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x58) <= (ulong)uVar13) {
      UniValue::~UniValue(&tests);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
LAB_0052fe64:
      __stack_chk_fail();
    }
    pUVar4 = UniValue::operator[](&tests,(ulong)uVar13);
    UniValue::write_abi_cxx11_((UniValue *)&strTest,(int)pUVar4,(void *)0x0,0);
    pUVar5 = UniValue::operator[](pUVar4,0);
    if (pUVar5->typ == VARR) {
      if ((long)(pUVar4->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pUVar4->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start == 0x108) {
        pUVar5 = UniValue::operator[](pUVar4,1);
        if (pUVar5->typ == VSTR) {
          pUVar5 = UniValue::operator[](pUVar4,2);
          if (pUVar5->typ == VSTR) {
            mapprevOutScriptPubKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            mapprevOutScriptPubKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            mapprevOutScriptPubKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &mapprevOutScriptPubKeys._M_t._M_impl.super__Rb_tree_header._M_header;
            mapprevOutScriptPubKeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            mapprevOutValues._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            mapprevOutValues._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
            ;
            mapprevOutValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &mapprevOutValues._M_t._M_impl.super__Rb_tree_header._M_header;
            mapprevOutValues._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            mapprevOutValues._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 mapprevOutValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            mapprevOutScriptPubKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 mapprevOutScriptPubKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            pUVar5 = UniValue::operator[](pUVar4,0);
            pUVar5 = UniValue::get_array(pUVar5);
            UniValue::UniValue(&inputs,pUVar5);
            uVar12 = 0;
            while( true ) {
              if ((ulong)(((long)inputs.values.
                                 super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)inputs.values.
                                super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                                super__Vector_impl_data._M_start) / 0x58) <= (ulong)uVar12) break;
              pUVar5 = UniValue::operator[](&inputs,(ulong)uVar12);
              if (pUVar5->typ != VARR) {
LAB_0052efe5:
                local_408 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                ;
                local_400 = "";
                local_418 = &boost::unit_test::basic_cstring<char_const>::null;
                local_410 = &boost::unit_test::basic_cstring<char_const>::null;
                msg_00.m_end = (iterator)in_R9;
                msg_00.m_begin = (iterator)in_R8;
                file_00.m_end = (iterator)0x144;
                file_00.m_begin = (iterator)&local_408;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
                           (size_t)&local_418,msg_00);
                state.super_ValidationState<TxValidationResult>._0_8_ =
                     state.super_ValidationState<TxValidationResult>._0_8_ & 0xffffffffffffff00;
                state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
                     (pointer)0x0;
                state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length = 0
                ;
                tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish._0_1_ = '\0';
                tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139a58;
                tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     (pointer)boost::unit_test::lazy_ostream::inst;
                tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_26187a;
                txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
                     txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._8_8_ &
                     0xffffffffffffff00;
                txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
                     &PTR__lazy_ostream_01139a98;
                local_428 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                ;
                local_420 = "";
                in_stack_fffffffffffffa08 = 0;
                in_stack_fffffffffffffa0c = 0;
                in_R8 = (PrecomputedTransactionData *)&DAT_00000001;
                in_R9 = (UniValue *)&DAT_00000001;
                txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = &tx;
                txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
                     (UniValue *)&strTest;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&state,(lazy_ostream *)&txdata,1,1,WARN,_cVar14,
                           (size_t)&local_428,0x144);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)
                           &state.super_ValidationState<TxValidationResult>.m_reject_reason.
                            _M_string_length);
                UniValue::~UniValue(&inputs);
                std::
                _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                ::~_Rb_tree(&mapprevOutValues._M_t);
                std::
                _Rb_tree<COutPoint,_std::pair<const_COutPoint,_CScript>,_std::_Select1st<std::pair<const_COutPoint,_CScript>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
                ::~_Rb_tree(&mapprevOutScriptPubKeys._M_t);
                goto LAB_0052efd5;
              }
              pUVar5 = UniValue::get_array(pUVar5);
              if (((long)(pUVar5->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(pUVar5->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x58 - 5U < 0xfffffffffffffffe)
              goto LAB_0052efe5;
              pUVar6 = UniValue::operator[](pUVar5,0);
              psVar7 = UniValue::get_str_abi_cxx11_(pUVar6);
              hex._M_str = (psVar7->_M_dataplus)._M_p;
              hex._M_len = psVar7->_M_string_length;
              transaction_identifier<false>::FromHex
                        ((optional<transaction_identifier<false>_> *)&tx,hex);
              if ((char)tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_finish == '\0') {
                if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                  std::__throw_bad_optional_access();
                }
                goto LAB_0052fe64;
              }
              pUVar6 = UniValue::operator[](pUVar5,1);
              txdata.m_sequences_single_hash.super_base_blob<256U>.m_data._M_elems._0_4_ =
                   UniValue::getInt<int>(pUVar6);
              txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._9_7_ =
                   tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_finish._1_7_;
              txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[8] =
                   (uchar)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
                   tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
                   tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start;
              txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
                   tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_start;
              pUVar6 = UniValue::operator[](pUVar5,2);
              psVar7 = UniValue::get_str_abi_cxx11_(pUVar6);
              ParseScript((CScript *)&tx,psVar7);
              this_00 = &std::
                         map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
                         ::operator[](&mapprevOutScriptPubKeys,(key_type *)&txdata)->
                         super_CScriptBase;
              prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                        (this_00,(prevector<28U,_unsigned_char,_unsigned_int,_int> *)&tx);
              prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                        ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&tx);
              if (3 < (ulong)(((long)(pUVar5->values).
                                     super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                              (long)(pUVar5->values).
                                    super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                                    super__Vector_impl_data._M_start) / 0x58)) {
                pUVar5 = UniValue::operator[](pUVar5,3);
                lVar8 = UniValue::getInt<long>(pUVar5);
                pmVar9 = std::
                         map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                         ::operator[](&mapprevOutValues,(key_type *)&txdata);
                *pmVar9 = lVar8;
              }
              uVar12 = uVar12 + 1;
            }
            pUVar5 = UniValue::operator[](pUVar4,1);
            psVar7 = UniValue::get_str_abi_cxx11_(pUVar5);
            std::__cxx11::string::string((string *)&transaction,psVar7);
            hex_str._M_str = transaction._M_dataplus._M_p;
            hex_str._M_len = transaction._M_string_length;
            ParseHex<unsigned_char>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&txdata,hex_str);
            sp.m_size = txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._8_8_ -
                        txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
            sp.m_data = (byte *)txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems.
                                _0_8_;
            DataStream::DataStream(&stream,sp);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txdata);
            CTransaction::CTransaction<DataStream>(&tx,&::TX_WITH_WITNESS,&stream);
            state.super_ValidationState<TxValidationResult>.m_mode = M_VALID;
            state.super_ValidationState<TxValidationResult>.m_result = TX_RESULT_UNSET;
            state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
                 (pointer)&state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2;
            state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length = 0;
            state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_local_buf[0]
                 = '\0';
            state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
                 (pointer)&state.super_ValidationState<TxValidationResult>.m_debug_message.field_2;
            state.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length = 0;
            state.super_ValidationState<TxValidationResult>.m_debug_message.field_2._M_local_buf[0]
                 = '\0';
            bVar2 = CheckTransaction(&tx,&state);
            if (bVar2 && state.super_ValidationState<TxValidationResult>.m_mode != M_INVALID) {
              PrecomputedTransactionData::PrecomputedTransactionData<CTransaction>(&txdata,&tx);
              pUVar4 = UniValue::operator[](pUVar4,2);
              psVar7 = UniValue::get_str_abi_cxx11_(pUVar4);
              std::__cxx11::string::string(local_398,psVar7);
              strFlags._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffa0c;
              strFlags._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffa08;
              strFlags._M_string_length = (size_type)_cVar14;
              strFlags.field_2._M_allocated_capacity = (size_type)this_01;
              strFlags.field_2._8_8_ = in_stack_fffffffffffffa20;
              flags = ParseScriptFlags(strFlags);
              std::__cxx11::string::~string(local_398);
              _Var3 = FillFlags(flags);
              if (flags != _Var3) {
                local_488 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                ;
                local_480 = "";
                local_498 = &boost::unit_test::basic_cstring<char_const>::null;
                local_490 = &boost::unit_test::basic_cstring<char_const>::null;
                msg_01.m_end = (iterator)in_R9;
                msg_01.m_begin = (iterator)in_R8;
                file_01.m_end = (iterator)0x157;
                file_01.m_begin = (iterator)&local_488;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
                           (size_t)&local_498,msg_01);
                local_550._0_8_ = local_550._0_8_ & 0xffffffffffffff00;
                local_550.m_message.px = (element_type *)0x0;
                local_550.m_message.pn.pi_ = (sp_counted_base *)0x0;
                local_4b8[8] = false;
                local_4b8._0_8_ = &PTR__lazy_ostream_0113ed30;
                local_4a8 = (undefined ***)boost::unit_test::lazy_ostream::inst;
                local_4a0 = (UniValue *)0xc3e65e;
                local_3c0 = (element_type *)((ulong)local_3c0 & 0xffffffffffffff00);
                local_3c8 = (undefined1  [8])&PTR__lazy_ostream_0113ed70;
                _Stack_3b8._M_p = local_4b8;
                local_4c8 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                ;
                local_4c0 = "";
                in_R8 = (PrecomputedTransactionData *)&DAT_00000001;
                in_R9 = (UniValue *)&DAT_00000001;
                local_3b0 = (UniValue *)&strTest;
                boost::test_tools::tt_detail::report_assertion
                          (&local_550,(lazy_ostream *)local_3c8,1,1,WARN,_cVar14,(size_t)&local_4c8,
                           0x157);
                boost::detail::shared_count::~shared_count(&local_550.m_message.pn);
              }
              local_4d8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
              ;
              local_4d0 = "";
              local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_02.m_end = (iterator)in_R9;
              msg_02.m_begin = (iterator)in_R8;
              file_02.m_end = (iterator)0x15c;
              file_02.m_begin = (iterator)&local_4d8;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,
                         (size_t)&local_4e8,msg_02);
              bVar2 = CheckTxScripts(&tx,&mapprevOutScriptPubKeys,&mapprevOutValues,flags,&txdata,
                                     &strTest,false);
              local_550.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
              value = (readonly_property<bool>)(readonly_property<bool>)bVar2;
              local_550.m_message.px = (element_type *)0x0;
              local_550.m_message.pn.pi_ = (sp_counted_base *)0x0;
              local_4b8[8] = false;
              local_4b8._0_8_ = &PTR__lazy_ostream_01139b58;
              local_4a8 = (undefined ***)boost::unit_test::lazy_ostream::inst;
              local_4a0 = (UniValue *)0xc3e6fc;
              local_3c0 = (element_type *)((ulong)local_3c0 & 0xffffffffffffff00);
              local_3c8 = (undefined1  [8])&PTR__lazy_ostream_0113edb0;
              _Stack_3b8._M_p = local_4b8;
              local_4f8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
              ;
              local_4f0 = "";
              in_stack_fffffffffffffa08 = 0;
              in_stack_fffffffffffffa0c = 0;
              in_R8 = (PrecomputedTransactionData *)&DAT_00000001;
              in_R9 = (UniValue *)&DAT_00000001;
              local_3b0 = (UniValue *)&strTest;
              boost::test_tools::tt_detail::report_assertion
                        (&local_550,(lazy_ostream *)local_3c8,1,1,WARN,_cVar14,(size_t)&local_4f8,
                         0x15c);
              boost::detail::shared_count::~shared_count(&local_550.m_message.pn);
              for (p_Var11 = mapFlagNames_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header.
                             _M_left;
                  (_Rb_tree_header *)p_Var11 !=
                  &mapFlagNames_abi_cxx11_._M_t._M_impl.super__Rb_tree_header;
                  p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
                uVar12 = FillFlags(p_Var11[2]._M_color | flags);
                txdata_00 = &txdata;
                pUVar4 = (UniValue *)&strTest;
                bVar2 = CheckTxScripts(&tx,&mapprevOutScriptPubKeys,&mapprevOutValues,uVar12,
                                       txdata_00,&strTest,false);
                if (!bVar2) {
                  local_508 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                  ;
                  local_500 = "";
                  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
                  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
                  msg_03.m_end = (iterator)pUVar4;
                  msg_03.m_begin = (iterator)txdata_00;
                  file_03.m_end = (iterator)0x163;
                  file_03.m_begin = (iterator)&local_508;
                  boost::unit_test::unit_test_log_t::set_checkpoint
                            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,
                             (size_t)&local_518,msg_03);
                  local_530.p_predicate_value.super_readonly_property<bool>.
                  super_class_property<bool>.value =
                       (readonly_property<bool>)(class_property<bool>)0x0;
                  local_530.m_message.px = (element_type *)0x0;
                  local_530.m_message.pn.pi_ = (sp_counted_base *)0x0;
                  local_570.m_message.px =
                       (element_type *)((ulong)local_570.m_message.px & 0xffffffffffffff00);
                  local_570._0_8_ = &PTR__lazy_ostream_0113c708;
                  local_570.m_message.pn.pi_ =
                       (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                  local_558 = "Tx unexpectedly passed with flag ";
                  local_550.m_message.px =
                       (element_type *)((ulong)local_550.m_message.px & 0xffffffffffffff00);
                  local_550._0_8_ = &PTR__lazy_ostream_0113edf0;
                  local_550.m_message.pn.pi_ = (sp_counted_base *)&local_570;
                  local_4b8[8] = false;
                  local_4b8._0_8_ = &PTR__lazy_ostream_0113ef70;
                  local_4a8 = (undefined ***)&local_550;
                  local_4a0 = (UniValue *)0xc3e76f;
                  local_3c0 = (element_type *)((ulong)local_3c0 & 0xffffffffffffff00);
                  local_3c8 = (undefined1  [8])&PTR__lazy_ostream_0113efb0;
                  _Stack_3b8._M_p = local_4b8;
                  local_580 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                  ;
                  local_578 = "";
                  in_stack_fffffffffffffa0c = 0;
                  local_538 = p_Var11 + 1;
                  local_3b0 = (UniValue *)&strTest;
                  boost::test_tools::tt_detail::report_assertion
                            (&local_530,(lazy_ostream *)local_3c8,1,1,WARN,_cVar14,
                             (size_t)&local_580,0x163);
                  boost::detail::shared_count::~shared_count(&local_530.m_message.pn);
                }
                uVar10 = RandomMixin<FastRandomContext>::randbits
                                   (this_01,(int)mapFlagNames_abi_cxx11_._M_t._M_impl.
                                                 super__Rb_tree_header._M_node_count);
                uVar12 = FillFlags((_Rb_tree_color)uVar10 | flags);
                in_stack_fffffffffffffa08 = 0;
                in_R8 = &txdata;
                in_R9 = (UniValue *)&strTest;
                bVar2 = CheckTxScripts(&tx,&mapprevOutScriptPubKeys,&mapprevOutValues,uVar12,in_R8,
                                       &strTest,false);
                if (!bVar2) {
                  local_590 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                  ;
                  local_588 = "";
                  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
                  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
                  msg_04.m_end = (iterator)in_R9;
                  msg_04.m_begin = (iterator)in_R8;
                  file_04.m_end = (iterator)0x168;
                  file_04.m_begin = (iterator)&local_590;
                  boost::unit_test::unit_test_log_t::set_checkpoint
                            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,
                             (size_t)&local_5a0,msg_04);
                  local_550.m_message.px =
                       (element_type *)((ulong)local_550.m_message.px & 0xffffffffffffff00);
                  local_550._0_8_ = &PTR__lazy_ostream_0113eeb0;
                  local_550.m_message.pn.pi_ = (sp_counted_base *)&local_570;
                  local_530.p_predicate_value.super_readonly_property<bool>.
                  super_class_property<bool>.value =
                       (readonly_property<bool>)(class_property<bool>)0x0;
                  local_530.m_message.px = (element_type *)0x0;
                  local_530.m_message.pn.pi_ = (sp_counted_base *)0x0;
                  local_570.m_message.px =
                       (element_type *)((ulong)local_570.m_message.px & 0xffffffffffffff00);
                  local_570._0_8_ = &PTR__lazy_ostream_011398f0;
                  local_570.m_message.pn.pi_ =
                       (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                  local_558 = "Tx unexpectedly passed with random flags ";
                  local_4b8[8] = false;
                  local_4b8._0_8_ = &PTR__lazy_ostream_0113eef0;
                  local_4a8 = (undefined ***)&local_550;
                  local_4a0 = (UniValue *)0xb4adce;
                  local_3c0 = (element_type *)((ulong)local_3c0 & 0xffffffffffffff00);
                  local_3c8 = (undefined1  [8])&PTR__lazy_ostream_0113ef30;
                  _Stack_3b8._M_p = local_4b8;
                  local_5b0 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                  ;
                  local_5a8 = "";
                  in_stack_fffffffffffffa08 = 0;
                  in_stack_fffffffffffffa0c = 0;
                  in_R8 = (PrecomputedTransactionData *)&DAT_00000001;
                  in_R9 = (UniValue *)&DAT_00000001;
                  local_538 = p_Var11 + 1;
                  local_3b0 = (UniValue *)&strTest;
                  boost::test_tools::tt_detail::report_assertion
                            (&local_530,(lazy_ostream *)local_3c8,1,1,WARN,_cVar14,
                             (size_t)&local_5b0,0x168);
                  boost::detail::shared_count::~shared_count(&local_530.m_message.pn);
                }
              }
              ExcludeIndividualFlags
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)local_3c8,flags);
              for (pUVar4 = local_3b0; pUVar4 != (UniValue *)&local_3c0;
                  pUVar4 = (UniValue *)std::_Rb_tree_increment((_Rb_tree_node_base *)pUVar4)) {
                in_stack_fffffffffffffa08 = 1;
                in_R8 = &txdata;
                in_R9 = (UniValue *)&strTest;
                bVar2 = CheckTxScripts(&tx,&mapprevOutScriptPubKeys,&mapprevOutValues,
                                       *(uint *)((long)&(pUVar4->val).field_2 + 8),in_R8,&strTest,
                                       true);
                if (!bVar2) {
                  local_5c0 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                  ;
                  local_5b8 = "";
                  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
                  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
                  msg_06.m_end = (iterator)in_R9;
                  msg_06.m_begin = (iterator)in_R8;
                  file_06.m_end = (iterator)0x16f;
                  file_06.m_begin = (iterator)&local_5c0;
                  boost::unit_test::unit_test_log_t::set_checkpoint
                            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
                             (size_t)&local_5d0,msg_06);
                  local_570._0_8_ = local_570._0_8_ & 0xffffffffffffff00;
                  local_570.m_message.px = (element_type *)0x0;
                  local_570.m_message.pn.pi_ = (sp_counted_base *)0x0;
                  local_550.m_message.px =
                       (element_type *)((ulong)local_550.m_message.px & 0xffffffffffffff00);
                  local_550._0_8_ = &PTR__lazy_ostream_0113bfa8;
                  local_550.m_message.pn.pi_ =
                       (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                  local_538 = (_Rb_tree_node_base *)0xc3e761;
                  local_4b8[8] = false;
                  local_4b8._0_8_ = &PTR__lazy_ostream_0113bf68;
                  local_4a8 = (undefined ***)&local_550;
                  in_stack_fffffffffffffa20 =
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                  ;
                  in_stack_fffffffffffffa08 = 0;
                  in_stack_fffffffffffffa0c = 0;
                  in_R8 = (PrecomputedTransactionData *)&DAT_00000001;
                  in_R9 = (UniValue *)&DAT_00000001;
                  local_4a0 = (UniValue *)&strTest;
                  boost::test_tools::tt_detail::report_assertion
                            (&local_570,(lazy_ostream *)local_4b8,1,1,WARN,_cVar14,
                             (size_t)&stack0xfffffffffffffa20,0x16f);
                  boost::detail::shared_count::~shared_count(&local_570.m_message.pn);
                }
              }
              std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)local_3c8);
              std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&txdata.m_spent_outputs);
            }
            else {
              local_458 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
              ;
              local_450 = "";
              local_468 = &boost::unit_test::basic_cstring<char_const>::null;
              local_460 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_05.m_end = (iterator)in_R9;
              msg_05.m_begin = (iterator)in_R8;
              file_05.m_end = (iterator)0x14e;
              file_05.m_begin = (iterator)&local_458;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,
                         (size_t)&local_468,msg_05);
              pUVar4 = UniValue::operator[](pUVar4,2);
              psVar7 = UniValue::get_str_abi_cxx11_(pUVar4);
              bVar2 = std::operator==(psVar7,"BADTX");
              local_3c8[0] = bVar2;
              local_3c0 = (element_type *)0x0;
              _Stack_3b8._M_p = (pointer)0x0;
              txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
                   txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._8_8_ &
                   0xffffffffffffff00;
              txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
                   &PTR__lazy_ostream_01139e30;
              txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
                   boost::unit_test::lazy_ostream::inst;
              local_478 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
              ;
              local_470 = "";
              in_stack_fffffffffffffa08 = 0;
              in_stack_fffffffffffffa0c = 0;
              in_R8 = (PrecomputedTransactionData *)&DAT_00000001;
              in_R9 = (UniValue *)&DAT_00000001;
              txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
                   (UniValue *)&strTest;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_3c8,(lazy_ostream *)&txdata,1,1,WARN,_cVar14,
                         (size_t)&local_478,0x14e);
              boost::detail::shared_count::~shared_count((shared_count *)&_Stack_3b8);
            }
            ValidationState<TxValidationResult>::~ValidationState
                      (&state.super_ValidationState<TxValidationResult>);
            CTransaction::~CTransaction(&tx);
            std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                      ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&stream);
            std::__cxx11::string::~string((string *)&transaction);
            UniValue::~UniValue(&inputs);
            std::
            _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
            ::~_Rb_tree(&mapprevOutValues._M_t);
            std::
            _Rb_tree<COutPoint,_std::pair<const_COutPoint,_CScript>,_std::_Select1st<std::pair<const_COutPoint,_CScript>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
            ::~_Rb_tree(&mapprevOutScriptPubKeys._M_t);
            goto LAB_0052efd5;
          }
        }
      }
      local_3d8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
      ;
      local_3d0 = "";
      local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
      msg.m_end = (iterator)in_R9;
      msg.m_begin = (iterator)in_R8;
      file.m_end = (iterator)0x127;
      file.m_begin = (iterator)&local_3d8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_3e8,msg)
      ;
      inputs.typ._0_1_ = VNULL;
      inputs.val._M_dataplus._M_p = (pointer)0x0;
      inputs.val._M_string_length = 0;
      tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_1_ = '\0';
      tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&PTR__lazy_ostream_01139a58;
      tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
      tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)anon_var_dwarf_26187a;
      txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
           txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._8_8_ &
           0xffffffffffffff00;
      txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
           &PTR__lazy_ostream_01139a98;
      local_3f8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
      ;
      local_3f0 = "";
      in_stack_fffffffffffffa08 = 0;
      in_stack_fffffffffffffa0c = 0;
      in_R8 = (PrecomputedTransactionData *)&DAT_00000001;
      in_R9 = (UniValue *)&DAT_00000001;
      txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = &tx;
      txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
           (UniValue *)&strTest;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&inputs,(lazy_ostream *)&txdata,1,1,WARN,_cVar14,
                 (size_t)&local_3f8,0x127);
      boost::detail::shared_count::~shared_count((shared_count *)&inputs.val._M_string_length);
    }
LAB_0052efd5:
    std::__cxx11::string::~string((string *)&strTest);
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(tx_invalid)
{
    // Read tests from test/data/tx_invalid.json
    UniValue tests = read_json(json_tests::tx_invalid);

    for (unsigned int idx = 0; idx < tests.size(); idx++) {
        const UniValue& test = tests[idx];
        std::string strTest = test.write();
        if (test[0].isArray())
        {
            if (test.size() != 3 || !test[1].isStr() || !test[2].isStr())
            {
                BOOST_ERROR("Bad test: " << strTest);
                continue;
            }

            std::map<COutPoint, CScript> mapprevOutScriptPubKeys;
            std::map<COutPoint, int64_t> mapprevOutValues;
            UniValue inputs = test[0].get_array();
            bool fValid = true;
            for (unsigned int inpIdx = 0; inpIdx < inputs.size(); inpIdx++) {
                const UniValue& input = inputs[inpIdx];
                if (!input.isArray()) {
                    fValid = false;
                    break;
                }
                const UniValue& vinput = input.get_array();
                if (vinput.size() < 3 || vinput.size() > 4)
                {
                    fValid = false;
                    break;
                }
                COutPoint outpoint{Txid::FromHex(vinput[0].get_str()).value(), uint32_t(vinput[1].getInt<int>())};
                mapprevOutScriptPubKeys[outpoint] = ParseScript(vinput[2].get_str());
                if (vinput.size() >= 4)
                {
                    mapprevOutValues[outpoint] = vinput[3].getInt<int64_t>();
                }
            }
            if (!fValid)
            {
                BOOST_ERROR("Bad test: " << strTest);
                continue;
            }

            std::string transaction = test[1].get_str();
            DataStream stream(ParseHex(transaction));
            CTransaction tx(deserialize, TX_WITH_WITNESS, stream);

            TxValidationState state;
            if (!CheckTransaction(tx, state) || state.IsInvalid()) {
                BOOST_CHECK_MESSAGE(test[2].get_str() == "BADTX", strTest);
                continue;
            }

            PrecomputedTransactionData txdata(tx);
            unsigned int verify_flags = ParseScriptFlags(test[2].get_str());

            // Check that the test gives a valid combination of flags (otherwise VerifyScript will throw). Don't edit the flags.
            if (verify_flags != FillFlags(verify_flags)) {
                BOOST_ERROR("Bad test flags: " << strTest);
            }

            // Not using FillFlags() in the main test, in order to detect invalid verifyFlags combination
            BOOST_CHECK_MESSAGE(CheckTxScripts(tx, mapprevOutScriptPubKeys, mapprevOutValues, verify_flags, txdata, strTest, /*expect_valid=*/false),
                                "Tx unexpectedly passed: " << strTest);

            // Backwards compatibility of script verification flags: Adding any flag(s) should not validate an invalid transaction
            for (const auto& [name, flag] : mapFlagNames) {
                unsigned int flags = FillFlags(verify_flags | flag);
                // Adding individual flags
                if (!CheckTxScripts(tx, mapprevOutScriptPubKeys, mapprevOutValues, flags, txdata, strTest, /*expect_valid=*/false)) {
                    BOOST_ERROR("Tx unexpectedly passed with flag " << name << " set: " << strTest);
                }
                // Adding random combinations of flags
                flags = FillFlags(verify_flags | (unsigned int)m_rng.randbits(mapFlagNames.size()));
                if (!CheckTxScripts(tx, mapprevOutScriptPubKeys, mapprevOutValues, flags, txdata, strTest, /*expect_valid=*/false)) {
                    BOOST_ERROR("Tx unexpectedly passed with random flags " << name << ": " << strTest);
                }
            }

            // Check that flags are minimal: transaction should succeed if any set flags are unset.
            for (auto flags_excluding_one : ExcludeIndividualFlags(verify_flags)) {
                if (!CheckTxScripts(tx, mapprevOutScriptPubKeys, mapprevOutValues, flags_excluding_one, txdata, strTest, /*expect_valid=*/true)) {
                    BOOST_ERROR("Too many flags set: " << strTest);
                }
            }
        }
    }
}